

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DateImplementation.cpp
# Opt level: O2

JavascriptString * __thiscall
Js::DateImplementation::GetString
          (DateImplementation *this,DateStringFormat dsf,ScriptContext *requestContext,
          DateTimeFlag noDateTime)

{
  BOOL BVar1;
  JavascriptString *pJVar2;
  
  BVar1 = JavascriptNumber::IsNan(this->m_tvUtc);
  if (BVar1 != 0) {
    pJVar2 = StringCache::GetInvalidDate
                       (&((requestContext->super_ScriptContextBase).javascriptLibrary)->stringCache)
    ;
    return pJVar2;
  }
  if (dsf._value == '\x02') {
    EnsureYmdUtc(this);
    pJVar2 = GetDateGmtString(&this->m_ymdUtc,requestContext);
    return pJVar2;
  }
  EnsureYmdLcl<Js::ScriptContext>(this,requestContext);
  pJVar2 = GetDateDefaultString(&this->m_ymdLcl,&this->m_tzd,noDateTime,requestContext);
  return pJVar2;
}

Assistant:

JavascriptString*
    DateImplementation::GetString(DateStringFormat dsf,
        ScriptContext* requestContext, DateTimeFlag noDateTime)
    {
        if (JavascriptNumber::IsNan(m_tvUtc))
        {
            return requestContext->GetLibrary()->GetInvalidDateString();
        }

        switch (dsf)
         {
            default:
                EnsureYmdLcl(requestContext);
                return GetDateDefaultString(&m_ymdLcl, &m_tzd, noDateTime, requestContext);

#ifdef ENABLE_GLOBALIZATION
            case DateStringFormat::Locale:
                EnsureYmdLcl(requestContext);

                if( m_ymdLcl.year > 1600 && m_ymdLcl.year < 10000 )
                {
                    // The year falls in the range which can be handled by both the Win32
                    // function GetDateFormat and the COM+ date type
                    // - the latter is for forward compatibility with JS 7.
                    JavascriptString *bs = GetDateLocaleString(&m_ymdLcl, &m_tzd, noDateTime, requestContext);
                    if (bs != nullptr)
                    {
                        return bs;
                    }
                    else
                    {
                        return GetDateDefaultString(&m_ymdLcl, &m_tzd, noDateTime, requestContext);
                    }
                }
                else
                {
                    return GetDateDefaultString(&m_ymdLcl, &m_tzd, noDateTime, requestContext);
                }
#endif

            case DateStringFormat::GMT:
                EnsureYmdUtc();
                return GetDateGmtString(&m_ymdUtc, requestContext);
        }
    }